

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_client_program.cpp
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  error_category *in_RCX;
  system *in_RDI;
  error_code ec;
  
  uVar1 = boost::system::system_category(in_RDI);
  ec.m_cat = in_RCX;
  ec._0_8_ = uVar1;
  pbVar2 = boost::system::operator<<
                     ((system *)&std::cout,(basic_ostream<char,_std::char_traits<char>_> *)0x0,ec);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar2);
  return 0;
}

Assistant:

int main(void)
{
  boost::system::error_code ec;
  std::cout << ec << std::endl;
  return 0;
}